

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void av1_cdef_fb_row(AV1_COMMON *cm,MACROBLOCKD *xd,uint16_t **linebuf,uint16_t **colbuf,
                    uint16_t *src,int fbr,cdef_init_fb_row_t cdef_init_fb_row_fn,
                    AV1CdefSyncData *cdef_sync,aom_internal_error_info *error_info)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  code *in_stack_00000008;
  int fbc;
  _Bool cdef_mt_exit;
  int nhfb;
  int cdef_left [3];
  CdefBlockInfo fb_info;
  int local_ac8;
  undefined1 local_ab0 [28];
  int in_stack_fffffffffffff56c;
  int *in_stack_fffffffffffff570;
  uint16_t **in_stack_fffffffffffff578;
  CdefBlockInfo *in_stack_fffffffffffff580;
  MACROBLOCKD *in_stack_fffffffffffff588;
  AV1_COMMON *in_stack_fffffffffffff590;
  int in_stack_fffffffffffff5a0;
  
  iVar2 = *(int *)(in_RDI + 0x218);
  (*in_stack_00000008)(in_RDI,in_RSI,local_ab0,in_RDX,in_R8,_fbc);
  if ((_fbc != (undefined8 *)0x0) && (1 < *(int *)(in_RDI + 0x5cc0))) {
    pthread_mutex_lock((pthread_mutex_t *)*_fbc);
    bVar1 = *(byte *)((long)_fbc + 0x1c);
    pthread_mutex_unlock((pthread_mutex_t *)*_fbc);
    if ((bVar1 & 1) != 0) {
      return;
    }
  }
  for (local_ac8 = 0; local_ac8 < (iVar2 + 0xf) / 0x10; local_ac8 = local_ac8 + 1) {
    cdef_fb_col(in_stack_fffffffffffff590,in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                in_stack_fffffffffffff578,in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                in_stack_fffffffffffff5a0);
  }
  return;
}

Assistant:

void av1_cdef_fb_row(const AV1_COMMON *const cm, MACROBLOCKD *xd,
                     uint16_t **const linebuf, uint16_t **const colbuf,
                     uint16_t *const src, int fbr,
                     cdef_init_fb_row_t cdef_init_fb_row_fn,
                     struct AV1CdefSyncData *const cdef_sync,
                     struct aom_internal_error_info *error_info) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  CdefBlockInfo fb_info;
  int cdef_left[MAX_MB_PLANE] = { 1, 1, 1 };
  const int nhfb = (cm->mi_params.mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  cdef_init_fb_row_fn(cm, xd, &fb_info, linebuf, src, cdef_sync, fbr);
#if CONFIG_MULTITHREAD
  if (cdef_sync && cm->cdef_info.allocated_num_workers > 1) {
    pthread_mutex_lock(cdef_sync->mutex_);
    const bool cdef_mt_exit = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock(cdef_sync->mutex_);
    // Exit in case any worker has encountered an error.
    if (cdef_mt_exit) return;
  }
#endif
  for (int fbc = 0; fbc < nhfb; fbc++) {
    fb_info.frame_boundary[LEFT] = (MI_SIZE_64X64 * fbc == 0) ? 1 : 0;
    if (fbc != nhfb - 1)
      fb_info.frame_boundary[RIGHT] =
          (MI_SIZE_64X64 * (fbc + 1) == cm->mi_params.mi_cols) ? 1 : 0;
    else
      fb_info.frame_boundary[RIGHT] = 1;
    cdef_fb_col(cm, xd, &fb_info, colbuf, &cdef_left[0], fbc, fbr);
  }
}